

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O1

void helper_mtc0_vpeconf0_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = env->CP0_VPEConf0;
  uVar2 = 0x1fe00003;
  if ((uVar1 & 1) == 0) {
    uVar2 = 3;
  }
  env->CP0_VPEConf0 = ((uint)arg1 ^ uVar1) & (int)(uVar1 << 0x1e) >> 0x1f & uVar2 ^ uVar1;
  return;
}

Assistant:

void helper_mtc0_vpeconf0(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t mask = 0;
    uint32_t newval;

    if (env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP)) {
        if (env->CP0_VPEConf0 & (1 << CP0VPEC0_VPA)) {
            mask |= (0xff << CP0VPEC0_XTC);
        }
        mask |= (1 << CP0VPEC0_MVP) | (1 << CP0VPEC0_VPA);
    }
    newval = (env->CP0_VPEConf0 & ~mask) | (arg1 & mask);

    /* TODO: TC exclusive handling due to ERL/EXL. */

    env->CP0_VPEConf0 = newval;
}